

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

void Wlc_NtkShortNames(Wlc_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Wlc_Obj_t *pWVar4;
  uint local_98;
  int nFlops;
  int i;
  int fFound;
  int NameId;
  int nDigits;
  char pBuffer [100];
  Wlc_Obj_t *pObj;
  Wlc_Ntk_t *p_local;
  
  iVar1 = Wlc_NtkCoNum(p);
  iVar2 = Wlc_NtkPoNum(p);
  fFound = Abc_Base10Log(iVar1 - iVar2);
  for (local_98 = 0; iVar1 = Wlc_NtkCoNum(p), (int)local_98 < iVar1; local_98 = local_98 + 1) {
    pWVar4 = Wlc_NtkCo(p,local_98);
    iVar2 = Wlc_ObjIsPo(pWVar4);
    iVar1 = fFound;
    if (iVar2 == 0) {
      iVar2 = Wlc_NtkPoNum(p);
      sprintf((char *)&NameId,"%s%0*d","fi",(ulong)(uint)iVar1,(ulong)(local_98 - iVar2));
      i = Abc_NamStrFindOrAdd(p->pManName,(char *)&NameId,&nFlops);
      iVar1 = Wlc_ObjId(p,pWVar4);
      Wlc_ObjSetNameId(p,iVar1,i);
    }
  }
  for (local_98 = 0; iVar1 = Wlc_NtkCiNum(p), (int)local_98 < iVar1; local_98 = local_98 + 1) {
    pWVar4 = Wlc_NtkCi(p,local_98);
    iVar2 = Wlc_ObjIsPi(pWVar4);
    iVar1 = fFound;
    if (iVar2 == 0) {
      iVar2 = Wlc_NtkPiNum(p);
      sprintf((char *)&NameId,"%s%0*d","fo",(ulong)(uint)iVar1,(ulong)(local_98 - iVar2));
      i = Abc_NamStrFindOrAdd(p->pManName,(char *)&NameId,&nFlops);
      iVar1 = Wlc_ObjId(p,pWVar4);
      Wlc_ObjSetNameId(p,iVar1,i);
    }
  }
  uVar3 = Wlc_NtkPoNum(p);
  fFound = Abc_Base10Log(uVar3);
  for (local_98 = 0; iVar1 = Wlc_NtkPoNum(p), (int)local_98 < iVar1; local_98 = local_98 + 1) {
    pWVar4 = Wlc_NtkPo(p,local_98);
    sprintf((char *)&NameId,"%s%0*d","po",(ulong)(uint)fFound,(ulong)local_98);
    i = Abc_NamStrFindOrAdd(p->pManName,(char *)&NameId,&nFlops);
    iVar1 = Wlc_ObjId(p,pWVar4);
    Wlc_ObjSetNameId(p,iVar1,i);
  }
  uVar3 = Wlc_NtkPiNum(p);
  fFound = Abc_Base10Log(uVar3);
  for (local_98 = 0; iVar1 = Wlc_NtkPiNum(p), (int)local_98 < iVar1; local_98 = local_98 + 1) {
    pWVar4 = Wlc_NtkPi(p,local_98);
    sprintf((char *)&NameId,"%s%0*d","pi",(ulong)(uint)fFound,(ulong)local_98);
    i = Abc_NamStrFindOrAdd(p->pManName,(char *)&NameId,&nFlops);
    iVar1 = Wlc_ObjId(p,pWVar4);
    Wlc_ObjSetNameId(p,iVar1,i);
  }
  uVar3 = Wlc_NtkObjNum(p);
  fFound = Abc_Base10Log(uVar3);
  for (local_98 = 1; iVar1 = Wlc_NtkObjNumMax(p), (int)local_98 < iVar1; local_98 = local_98 + 1) {
    pWVar4 = Wlc_NtkObj(p,local_98);
    iVar1 = Wlc_ObjIsCi(pWVar4);
    if ((iVar1 == 0) && (iVar1 = Wlc_ObjIsCo(pWVar4), iVar1 == 0)) {
      sprintf((char *)&NameId,"%s%0*d","n",(ulong)(uint)fFound,(ulong)local_98);
      i = Abc_NamStrFindOrAdd(p->pManName,(char *)&NameId,&nFlops);
      iVar1 = Wlc_ObjId(p,pWVar4);
      Wlc_ObjSetNameId(p,iVar1,i);
    }
  }
  return;
}

Assistant:

void Wlc_NtkShortNames( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj;
    char pBuffer[100];
    int nDigits, NameId, fFound, i;
    int nFlops = Wlc_NtkCoNum(p) - Wlc_NtkPoNum(p);
    nDigits = Abc_Base10Log( nFlops );
    Wlc_NtkForEachCo( p, pObj, i )
    {
        if ( Wlc_ObjIsPo(pObj) )
            continue;
        sprintf( pBuffer, "%s%0*d", "fi", nDigits, i - Wlc_NtkPoNum(p) );
        NameId = Abc_NamStrFindOrAdd( p->pManName, pBuffer, &fFound );
        Wlc_ObjSetNameId( p, Wlc_ObjId(p, pObj), NameId );
    }
    Wlc_NtkForEachCi( p, pObj, i )
    {
        if ( Wlc_ObjIsPi(pObj) )
            continue;
        sprintf( pBuffer, "%s%0*d", "fo", nDigits, i - Wlc_NtkPiNum(p) );
        NameId = Abc_NamStrFindOrAdd( p->pManName, pBuffer, &fFound );
        Wlc_ObjSetNameId( p, Wlc_ObjId(p, pObj), NameId );
    }
    nDigits = Abc_Base10Log( Wlc_NtkPoNum(p) );
    Wlc_NtkForEachPo( p, pObj, i )
    {
        sprintf( pBuffer, "%s%0*d", "po", nDigits, i );
        NameId = Abc_NamStrFindOrAdd( p->pManName, pBuffer, &fFound );
        Wlc_ObjSetNameId( p, Wlc_ObjId(p, pObj), NameId );
    }
    nDigits = Abc_Base10Log( Wlc_NtkPiNum(p) );
    Wlc_NtkForEachPi( p, pObj, i )
    {
        sprintf( pBuffer, "%s%0*d", "pi", nDigits, i );
        NameId = Abc_NamStrFindOrAdd( p->pManName, pBuffer, &fFound );
        Wlc_ObjSetNameId( p, Wlc_ObjId(p, pObj), NameId );
    }
    nDigits = Abc_Base10Log( Wlc_NtkObjNum(p) );
    Wlc_NtkForEachObj( p, pObj, i )
    {
        if ( Wlc_ObjIsCi(pObj) || Wlc_ObjIsCo(pObj) )
            continue;
        sprintf( pBuffer, "%s%0*d", "n", nDigits, i );
        NameId = Abc_NamStrFindOrAdd( p->pManName, pBuffer, &fFound );
        Wlc_ObjSetNameId( p, Wlc_ObjId(p, pObj), NameId );
    }
}